

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.cc
# Opt level: O2

S2PointRegion * __thiscall S2PointRegion::Clone(S2PointRegion *this)

{
  S2PointRegion *this_00;
  
  this_00 = (S2PointRegion *)operator_new(0x20);
  S2PointRegion(this_00,&this->point_);
  return this_00;
}

Assistant:

S2PointRegion* S2PointRegion::Clone() const {
  return new S2PointRegion(point_);
}